

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

void mkElimClause(vec<unsigned_int,_int> *elimclauses,Var v,Clause *c)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  undefined8 in_RAX;
  int iVar4;
  ulong uVar5;
  undefined8 local_38;
  
  iVar1 = elimclauses->sz;
  iVar4 = -1;
  local_38 = in_RAX;
  if (0x1f < (uint)c->header) {
    uVar5 = 0;
    do {
      local_38 = CONCAT44(local_38._4_4_,c[uVar5 + 1].header);
      Minisat::vec<unsigned_int,_int>::push(elimclauses,(uint *)&local_38);
      if ((int)c[uVar5 + 1].header >> 1 == v) {
        iVar4 = iVar1 + (int)uVar5;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (uint)c->header >> 5);
  }
  if (iVar4 != -1) {
    puVar3 = elimclauses->data;
    uVar2 = puVar3[iVar4];
    puVar3[iVar4] = puVar3[iVar1];
    puVar3[iVar1] = uVar2;
    local_38 = CONCAT44((uint)c->header >> 5,(uint)local_38);
    Minisat::vec<unsigned_int,_int>::push(elimclauses,(uint *)((long)&local_38 + 4));
    return;
  }
  __assert_fail("v_pos != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/simp/SimpSolver.cc"
                ,0x1d7,"void mkElimClause(vec<uint32_t> &, Var, Clause &)");
}

Assistant:

static void mkElimClause(vec<uint32_t>& elimclauses, Var v, Clause& c)
{
    int first = elimclauses.size();
    int v_pos = -1;

    // Copy clause to elimclauses-vector. Remember position where the
    // variable 'v' occurs:
    for (int i = 0; i < c.size(); i++){
        elimclauses.push(toInt(c[i]));
        if (var(c[i]) == v)
            v_pos = i + first;
    }
    assert(v_pos != -1);

    // Swap the first literal with the 'v' literal, so that the literal
    // containing 'v' will occur first in the clause:
    uint32_t tmp = elimclauses[v_pos];
    elimclauses[v_pos] = elimclauses[first];
    elimclauses[first] = tmp;

    // Store the length of the clause last:
    elimclauses.push(c.size());
}